

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::FunctionCallVar::FunctionCallVar
          (FunctionCallVar *this,Generator *m,shared_ptr<kratos::FunctionStmtBlock> *func_def,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          *args,bool has_return)

{
  allocator<const_kratos::IRNode_*> *this_00;
  allocator<kratos::IRNode_*> *this_01;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  initializer_list<const_kratos::IRNode_*> __l_03;
  initializer_list<const_kratos::IRNode_*> __l_04;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  element_type *peVar6;
  element_type *peVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *pmVar8;
  element_type *peVar9;
  StmtException *this_02;
  element_type *peVar10;
  UserException *this_03;
  element_type *peVar11;
  element_type *peVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  bool *pbVar13;
  undefined **args_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args_01;
  char (*format_str) [30];
  char (*format_str_00) [44];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar14;
  undefined1 auVar15 [16];
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  uint local_594;
  iterator local_590;
  undefined8 local_588;
  undefined1 local_580 [8];
  shared_ptr<kratos::DPIFunctionStmtBlock> dpi;
  string local_568;
  string local_548;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_528;
  size_type num_arg;
  type_conflict1 *max_arg;
  type_conflict1 *min_arg;
  undefined1 local_504 [20];
  undefined1 local_4f0 [8];
  shared_ptr<kratos::BuiltInFunctionStmtBlock> builtin;
  element_type *local_4d8;
  _Base_ptr local_4d0;
  size_type local_4c8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_4c0;
  string local_4a8;
  string local_488;
  undefined1 local_468 [8];
  shared_ptr<kratos::Var> handle;
  element_type *local_450;
  element_type *local_448;
  _Base_ptr local_440;
  size_type local_438;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_430;
  string local_418;
  undefined1 local_3f2;
  allocator<const_kratos::IRNode_*> local_3f1;
  element_type *local_3f0;
  element_type *local_3e8;
  element_type **local_3e0;
  size_type local_3d8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_3d0;
  string local_3b8;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_398;
  mapped_type *arg_port;
  Generator *local_388;
  Generator **local_380;
  size_type local_378;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_370;
  string local_358;
  _Self local_338;
  _Self local_330;
  element_type *local_328;
  type *func_port;
  type *port_name;
  _Self local_310;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  allocator<char> local_2b1;
  string local_2b0;
  byte local_289;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *pmStack_288;
  bool has_return_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *args_local;
  shared_ptr<kratos::FunctionStmtBlock> *func_def_local;
  Generator *m_local;
  FunctionCallVar *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_260;
  basic_string_view<char> local_258;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_248;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_238;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  char *local_228;
  string *local_220;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_218;
  basic_string_view<char> local_208;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_1f8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_1e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_1d8;
  string *local_1d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1c8;
  basic_string_view<char> local_1b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_1a8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_198;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_188;
  string *local_180;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_178;
  basic_string_view<char> local_168;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_158;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char *local_138;
  string *local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_128;
  basic_string_view<char> local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_4;
  char *local_e0;
  string *local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_90;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_289 = has_return;
  pmStack_288 = args;
  args_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                *)func_def;
  func_def_local = (shared_ptr<kratos::FunctionStmtBlock> *)m;
  m_local = (Generator *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"",&local_2b1);
  aVar14.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,m,&local_2b0,1,1,false);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  args_00 = &PTR_accept_005b65e0;
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005b65e0;
  peVar6 = std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                      args_local);
  this->func_def_ = peVar6;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::map(&this->args_,pmStack_288);
  peVar7 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)args_local);
  pmVar8 = FunctionStmtBlock::ports_abi_cxx11_(peVar7);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
         *)&__range1,pmVar8);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                    *)&__range1);
  local_310._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)&__range1);
  while (bVar1 = std::operator!=(&__end1,&local_310), bVar1) {
    port_name = &std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>
                 ::operator*(&__end1)->first;
    func_port = (type *)std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::Port>>
                                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>
                                    *)port_name);
    local_328 = (element_type *)
                std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::Port>>
                          ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>
                            *)port_name);
    local_330._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
         ::find(pmStack_288,(key_type *)func_port);
    local_338._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
         ::end(pmStack_288);
    bVar1 = std::operator==(&local_330,&local_338);
    if (bVar1) {
      arg_port._6_1_ = 1;
      auVar15 = __cxa_allocate_exception(0x10);
      local_1d0 = &local_358;
      local_1d8 = "{0} is not connected";
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)func_port;
      local_1f8.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string_const&,char[21],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"{0} is not connected",(v7 *)func_port,auVar15._8_8_,
                      (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                      "{0} is not connected");
      local_1e8 = &local_1f8;
      local_208 = fmt::v7::to_string_view<char,_0>(local_1d8);
      local_58 = &local_218;
      local_60 = local_1e8;
      local_50 = local_1e8;
      local_40 = local_1e8;
      local_48 = local_58;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_58,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_1e8->string);
      format_str_01.size_ = local_218.desc_;
      format_str_01.data_ = (char *)local_208.size_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar14.values_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_218.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_358,(detail *)local_208.data_,format_str_01,args_02);
      local_388 = (Generator *)
                  std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_328);
      local_380 = &local_388;
      local_378 = 1;
      std::allocator<const_kratos::IRNode_*>::allocator
                ((allocator<const_kratos::IRNode_*> *)((long)&arg_port + 7));
      __l_04._M_len = local_378;
      __l_04._M_array = (iterator)local_380;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_370,__l_04,(allocator<const_kratos::IRNode_*> *)((long)&arg_port + 7));
      VarException::VarException(auVar15._0_8_,&local_358,&local_370);
      arg_port._6_1_ = 0;
      __cxa_throw(auVar15._0_8_,&VarException::typeinfo,VarException::~VarException);
    }
    local_398 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                 ::at(pmStack_288,(key_type *)func_port)->
                 super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
    peVar9 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_328);
    iVar2 = (*(peVar9->super_Var).super_IRNode._vptr_IRNode[7])();
    peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_398);
    iVar3 = (*(peVar12->super_IRNode)._vptr_IRNode[7])();
    if (iVar2 != iVar3) {
      local_3f2 = 1;
      auVar15 = __cxa_allocate_exception(0x10);
      local_180 = &local_3b8;
      local_188 = "{0}\'s width doesn\'t match";
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)func_port;
      local_1a8.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string_const&,char[26],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"{0}\'s width doesn\'t match",(v7 *)func_port,auVar15._8_8_,
                      (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                      "{0}\'s width doesn\'t match");
      local_198 = &local_1a8;
      local_1b8 = fmt::v7::to_string_view<char,_0>(local_188);
      local_68 = &local_1c8;
      local_70 = local_198;
      local_38 = local_198;
      local_28 = local_198;
      local_30 = local_68;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_68,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_198->string);
      format_str_02.size_ = local_1c8.desc_;
      format_str_02.data_ = (char *)local_1b8.size_;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar14.values_;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_1c8.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_3b8,(detail *)local_1b8.data_,format_str_02,args_03);
      local_3f0 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_328);
      local_3e8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_398);
      local_3e0 = &local_3f0;
      local_3d8 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_3f1);
      __l_03._M_len = local_3d8;
      __l_03._M_array = (iterator)local_3e0;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_3d0,__l_03,&local_3f1);
      VarException::VarException(auVar15._0_8_,&local_3b8,&local_3d0);
      local_3f2 = 0;
      __cxa_throw(auVar15._0_8_,&VarException::typeinfo,VarException::~VarException);
    }
    peVar9 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_328);
    pbVar13 = Var::is_signed(&peVar9->super_Var);
    bVar1 = *pbVar13;
    peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_398);
    pbVar13 = Var::is_signed(peVar12);
    args_00 = (undefined **)(ulong)(*pbVar13 & 1U);
    if ((bVar1 & 1U) != (*pbVar13 & 1U)) {
      handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1
      ;
      auVar15 = __cxa_allocate_exception(0x10);
      local_130 = &local_418;
      local_138 = "{0}\'s sign doesn\'t match";
      vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)func_port;
      local_158.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string_const&,char[25],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"{0}\'s sign doesn\'t match",(v7 *)func_port,auVar15._8_8_,
                      (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                      "{0}\'s sign doesn\'t match");
      local_148 = &local_158;
      local_168 = fmt::v7::to_string_view<char,_0>(local_138);
      local_78 = &local_178;
      local_80 = local_148;
      local_20 = local_148;
      local_10 = local_148;
      local_18 = local_78;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_78,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_148->string);
      format_str_03.size_ = local_178.desc_;
      format_str_03.data_ = (char *)local_168.size_;
      args_04.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar14.values_;
      args_04.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_178.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_418,(detail *)local_168.data_,format_str_03,args_04);
      local_450 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_328);
      local_448 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_398);
      local_440 = (_Base_ptr)&local_450;
      local_438 = 2;
      this_00 = (allocator<const_kratos::IRNode_*> *)
                ((long)&handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 7);
      std::allocator<const_kratos::IRNode_*>::allocator(this_00);
      __l_02._M_len = local_438;
      __l_02._M_array = (iterator)local_440;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_430,__l_02,this_00);
      VarException::VarException(auVar15._0_8_,&local_418,&local_430);
      handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0
      ;
      __cxa_throw(auVar15._0_8_,&VarException::typeinfo,VarException::~VarException);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>
    ::operator++(&__end1);
  }
  std::__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)args_local);
  FunctionStmtBlock::function_handler((FunctionStmtBlock *)local_468);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_468);
  if ((!bVar1) && ((local_289 & 1) != 0)) {
    peVar7 = std::
             __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)args_local);
    uVar4 = (*(peVar7->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])();
    if ((uVar4 & 1) == 0) {
      peVar7 = std::
               __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)args_local);
      uVar4 = (*(peVar7->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
      if ((uVar4 & 1) == 0) {
        peVar7 = std::
                 __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)args_local);
        uVar4 = (*(peVar7->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x11])();
        if ((uVar4 & 1) == 0) {
          builtin.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._6_1_ = 1;
          this_02 = (StmtException *)__cxa_allocate_exception(0x10);
          peVar7 = std::
                   __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)args_local);
          FunctionStmtBlock::function_name_abi_cxx11_(&local_4a8,peVar7);
          local_220 = &local_488;
          local_228 = "{0} doesn\'t have return value";
          vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_4a8;
          local_248.named_args.data =
               (named_arg_info<char> *)
               fmt::v7::make_args_checked<std::__cxx11::string,char[30],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"{0} doesn\'t have return value",(v7 *)vargs_3,format_str,
                          (remove_reference_t<std::__cxx11::basic_string<char>_> *)args_00);
          local_238 = &local_248;
          local_258 = fmt::v7::to_string_view<char,_0>(local_228);
          local_b8 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&this_local;
          local_c0 = local_238;
          local_b0 = local_238;
          local_88 = local_238;
          local_a8 = local_b8;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_b8,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_238->string);
          format_str_04.size_ = (size_t)this_local;
          format_str_04.data_ = (char *)local_258.size_;
          args_05.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar14.values_;
          args_05.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_260.values_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_488,(detail *)local_258.data_,format_str_04,args_05);
          local_4d8 = std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                  *)args_local);
          local_4d0 = (_Base_ptr)&local_4d8;
          local_4c8 = 1;
          this_01 = (allocator<kratos::IRNode_*> *)
                    ((long)&builtin.
                            super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 7);
          std::allocator<kratos::IRNode_*>::allocator(this_01);
          __l_01._M_len = local_4c8;
          __l_01._M_array = (iterator)local_4d0;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    (&local_4c0,__l_01,this_01);
          StmtException::StmtException(this_02,&local_488,&local_4c0);
          builtin.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._6_1_ = 0;
          __cxa_throw(this_02,&StmtException::typeinfo,StmtException::~StmtException);
        }
      }
    }
  }
  if ((local_289 & 1) != 0) {
    peVar7 = std::
             __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)args_local);
    uVar4 = (*(peVar7->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
    if ((uVar4 & 1) != 0) {
      std::__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)args_local);
      Stmt::as<kratos::BuiltInFunctionStmtBlock>((Stmt *)local_4f0);
      peVar10 = std::
                __shared_ptr_access<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_4f0);
      uVar5 = BuiltInFunctionStmtBlock::return_width(peVar10);
      if (uVar5 != 0) {
        peVar10 = std::
                  __shared_ptr_access<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_4f0);
        uVar5 = BuiltInFunctionStmtBlock::return_width(peVar10);
        (this->super_Var).var_width_ = uVar5;
        local_504._0_4_ = 1;
        local_504._4_8_ = local_504;
        local_504._12_8_ = 1;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_504._4_8_;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&(this->super_Var).size_,__l_00);
        peVar10 = std::
                  __shared_ptr_access<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_4f0);
        bVar1 = BuiltInFunctionStmtBlock::is_signed(peVar10);
        (this->super_Var).is_signed_ = bVar1;
        peVar10 = std::
                  __shared_ptr_access<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_4f0);
        register0x00000000 = BuiltInFunctionStmtBlock::num_args(peVar10);
        max_arg = std::get<0ul,unsigned_int,unsigned_int>
                            ((pair<unsigned_int,_unsigned_int> *)((long)&min_arg + 4));
        num_arg = (size_type)
                  std::get<1ul,unsigned_int,unsigned_int>
                            ((pair<unsigned_int,_unsigned_int> *)((long)&min_arg + 4));
        local_528 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                    ::size(pmStack_288);
        args_01 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)(ulong)*max_arg;
        if ((local_528 < args_01) ||
           (args_01 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
                      (ulong)*(uint *)num_arg, args_01 < local_528)) {
          dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._7_1_ = 1;
          this_03 = (UserException *)__cxa_allocate_exception(0x10);
          peVar7 = std::
                   __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)args_local);
          FunctionStmtBlock::function_name_abi_cxx11_(&local_568,peVar7);
          local_d8 = &local_548;
          local_e0 = "Invalid number of arguments to function {0}";
          vargs_4 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_568;
          local_108.named_args.data =
               (named_arg_info<char> *)
               fmt::v7::make_args_checked<std::__cxx11::string,char[44],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"Invalid number of arguments to function {0}",(v7 *)vargs_4,
                          format_str_00,args_01);
          local_f0 = &local_108;
          local_118 = fmt::v7::to_string_view<char,_0>(local_e0);
          local_c8 = &local_128;
          local_d0 = local_f0;
          local_a0 = local_f0;
          local_90 = local_f0;
          local_98 = local_c8;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_c8,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_f0->string);
          format_str_05.size_ = local_128.desc_;
          format_str_05.data_ = (char *)local_118.size_;
          args_06.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar14.values_;
          args_06.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_128.field_1.values_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_548,(detail *)local_118.data_,format_str_05,args_06);
          UserException::UserException(this_03,&local_548);
          dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._7_1_ = 0;
          __cxa_throw(this_03,&UserException::typeinfo,UserException::~UserException);
        }
      }
      std::shared_ptr<kratos::BuiltInFunctionStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::BuiltInFunctionStmtBlock> *)local_4f0);
      goto LAB_002135da;
    }
  }
  if ((local_289 & 1) != 0) {
    peVar7 = std::
             __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)args_local);
    uVar4 = (*(peVar7->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])();
    if ((uVar4 & 1) != 0) {
      std::__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)args_local);
      Stmt::as<kratos::DPIFunctionStmtBlock>((Stmt *)local_580);
      peVar11 = std::
                __shared_ptr_access<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_580);
      uVar5 = DPIFunctionStmtBlock::return_width(peVar11);
      if (uVar5 != 0) {
        peVar11 = std::
                  __shared_ptr_access<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_580);
        uVar5 = DPIFunctionStmtBlock::return_width(peVar11);
        (this->super_Var).var_width_ = uVar5;
        local_594 = 1;
        local_590 = &local_594;
        local_588 = 1;
        __l._M_len = 1;
        __l._M_array = local_590;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&(this->super_Var).size_,__l);
        (this->super_Var).is_signed_ = false;
      }
      std::shared_ptr<kratos::DPIFunctionStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::DPIFunctionStmtBlock> *)local_580);
      goto LAB_002135da;
    }
  }
  if (((local_289 & 1) != 0) &&
     (bVar1 = std::operator!=((shared_ptr<kratos::Var> *)local_468,(nullptr_t)0x0), bVar1)) {
    peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_468);
    uVar5 = (*(peVar12->super_IRNode)._vptr_IRNode[7])();
    (this->super_Var).var_width_ = uVar5;
    peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_468);
    __x = Var::size(peVar12);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&(this->super_Var).size_,__x);
    peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_468);
    pbVar13 = Var::is_signed(peVar12);
    (this->super_Var).is_signed_ = (bool)(*pbVar13 & 1);
  }
LAB_002135da:
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_468);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
          *)&__range1);
  return;
}

Assistant:

FunctionCallVar::FunctionCallVar(Generator *m, const std::shared_ptr<FunctionStmtBlock> &func_def,
                                 const std::map<std::string, std::shared_ptr<Var>> &args,
                                 bool has_return)
    : Var(m, "", 1, 1, false), func_def_(func_def.get()), args_(args) {
    // check the function call types
    auto ports = func_def->ports();
    for (auto const &[port_name, func_port] : ports) {
        if (args.find(port_name) == args.end()) {
            throw VarException(::format("{0} is not connected", port_name), {func_port.get()});
        }
        // check the port types
        auto const &arg_port = args.at(port_name);
        if (func_port->width() != arg_port->width())
            throw VarException(::format("{0}'s width doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
        if (func_port->is_signed() != arg_port->is_signed())
            throw VarException(::format("{0}'s sign doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
    }
    // compute the width and sign
    auto handle = func_def->function_handler();
    if (!handle && has_return && !func_def->is_dpi() && !func_def->is_builtin() &&
        !func_def->is_task())
        throw StmtException(::format("{0} doesn't have return value", func_def->function_name()),
                            {func_def.get()});
    if (has_return && func_def->is_builtin()) {
        auto builtin = func_def->as<BuiltInFunctionStmtBlock>();
        if (builtin->return_width()) {
            var_width_ = builtin->return_width();
            size_ = {1};
            is_signed_ = builtin->is_signed();
            auto [min_arg, max_arg] = builtin->num_args();
            auto num_arg = args.size();
            if (num_arg < min_arg || num_arg > max_arg) {
                throw UserException(fmt::format("Invalid number of arguments to function {0}",
                                                func_def->function_name()));
            }
        }
        // check num of args
    } else if (has_return && func_def->is_dpi()) {
        auto dpi = func_def->as<DPIFunctionStmtBlock>();
        if (dpi->return_width()) {
            var_width_ = dpi->return_width();
            // FIXME: always size 1?
            size_ = {1};
            is_signed_ = false;
        }
    } else if (has_return && handle != nullptr) {
        var_width_ = handle->width();
        size_ = handle->size();
        is_signed_ = handle->is_signed();
    }
}